

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O0

pair<const_unsigned_short_*,_const_unsigned_short_*> __thiscall
frozen::
unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>::
equal_range<int>(unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>
                 *this,int *key)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  const_iterator local_30;
  const_iterator it;
  int *key_local;
  unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>
  *this_local;
  
  it = (const_iterator)key;
  key_local = (int *)this;
  pvVar1 = find<int>(this,key);
  local_30 = pvVar1;
  pvVar2 = end(this);
  if (pvVar1 == pvVar2) {
    local_40 = bits::carray<unsigned_short,_3UL>::end(&this->keys_);
    local_48 = bits::carray<unsigned_short,_3UL>::end(&this->keys_);
    std::pair<const_unsigned_short_*,_const_unsigned_short_*>::
    pair<const_unsigned_short_*,_const_unsigned_short_*,_true>
              ((pair<const_unsigned_short_*,_const_unsigned_short_*> *)&this_local,&local_40,
               &local_48);
  }
  else {
    local_38 = local_30 + 1;
    std::pair<const_unsigned_short_*,_const_unsigned_short_*>::pair<const_unsigned_short_*,_true>
              ((pair<const_unsigned_short_*,_const_unsigned_short_*> *)&this_local,&local_30,
               &local_38);
  }
  return _this_local;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }